

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  ulong uVar1;
  long lVar2;
  TestEventListeners *this_00;
  StreamingListener *this_01;
  ostream *poVar3;
  long in_FS_OFFSET;
  size_t pos;
  string *target;
  UnitTestImpl *this_local;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    lVar2 = std::__cxx11::string::find('(',0x3a);
    if (lVar2 == -1) {
      GTestLog::GTestLog((GTestLog *)((long)&this_local + 4),GTEST_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest.cc"
                         ,0x1356);
      poVar3 = GTestLog::GetStream((GTestLog *)((long)&this_local + 4));
      poVar3 = std::operator<<(poVar3,"unrecognized streaming target \"");
      poVar3 = std::operator<<(poVar3,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
      std::operator<<(poVar3,"\" ignored.");
      GTestLog::~GTestLog((GTestLog *)((long)&this_local + 4));
    }
    else {
      this_00 = listeners(this);
      this_01 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)&local_30,0x215828);
      std::__cxx11::string::substr((ulong)&local_50,0x215828);
      StreamingListener::StreamingListener(this_01,&local_30,&local_50);
      TestEventListeners::Append(this_00,(TestEventListener *)this_01);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      GTEST_LOG_(WARNING) << "unrecognized streaming target \"" << target
                          << "\" ignored.";
    }
  }
}